

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int apply_aug(lys_node_augment *augment,unres_schema *unres)

{
  lys_ext_instance *plVar1;
  int iVar2;
  lys_node *plVar3;
  lys_module *mod;
  bool bVar4;
  lys_ext_instance *ext;
  uint8_t *v;
  uint u;
  int clear_config;
  lys_node *parent;
  lys_node *child;
  unres_schema *unres_local;
  lys_node_augment *augment_local;
  
  if ((augment->target == (lys_node *)0x0) || ((augment->flags & 1) == 0)) {
    __assert_fail("augment->target && (augment->flags & LYS_NOTAPPLIED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x110f,"int apply_aug(struct lys_node_augment *, struct unres_schema *)");
  }
  if (augment->child != (lys_node *)0x0) {
    _u = augment->target;
    while( true ) {
      bVar4 = false;
      if (_u != (lys_node *)0x0) {
        bVar4 = (_u->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar4) break;
      _u = lys_parent(_u);
    }
    for (parent = augment->child; parent != (lys_node *)0x0; parent = parent->next) {
      iVar2 = inherit_config_flag(parent,augment->target->flags & 3,(uint)(_u != (lys_node *)0x0));
      if (iVar2 != 0) {
        return -1;
      }
    }
    for (v._0_4_ = 0; (uint)v < augment->target->ext_size; v._0_4_ = (uint)v + 1) {
      plVar1 = augment->target->ext[(uint)v];
      if (((plVar1 != (lys_ext_instance *)0x0) && (plVar1->def->plugin != (lyext_plugin *)0x0)) &&
         ((plVar1->def->plugin->flags & 1) != 0)) {
        plVar3 = (lys_node *)malloc(1);
        if (plVar3 == (lys_node *)0x0) {
          ly_log(augment->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "apply_aug");
          return -1;
        }
        *(char *)&plVar3->name = (char)(uint)v;
        mod = lys_main_module(augment->module);
        iVar2 = unres_schema_add_node(mod,unres,&augment->target->ext,UNRES_EXT_FINALIZE,plVar3);
        if (iVar2 == -1) {
          return -1;
        }
      }
    }
    if (augment->target->child == (lys_node *)0x0) {
      augment->target->child = augment->child;
    }
    else {
      plVar3 = augment->target->child->prev;
      plVar3->next = augment->child;
      augment->target->child->prev = augment->child->prev;
      augment->child->prev = plVar3;
    }
  }
  augment->flags = augment->flags & 0xfffe;
  return 0;
}

Assistant:

int
apply_aug(struct lys_node_augment *augment, struct unres_schema *unres)
{
    struct lys_node *child, *parent;
    int clear_config;
    unsigned int u;
    uint8_t *v;
    struct lys_ext_instance *ext;

    assert(augment->target && (augment->flags & LYS_NOTAPPLIED));

    if (!augment->child) {
        /* nothing to apply */
        goto success;
    }

    /* inherit config information from actual parent */
    for (parent = augment->target; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); parent = lys_parent(parent));
    clear_config = (parent) ? 1 : 0;
    LY_TREE_FOR(augment->child, child) {
        if (inherit_config_flag(child, augment->target->flags & LYS_CONFIG_MASK, clear_config)) {
            return -1;
        }
    }

    /* inherit extensions if any */
    for (u = 0; u < augment->target->ext_size; u++) {
        ext = augment->target->ext[u]; /* shortcut */
        if (ext && ext->def->plugin && (ext->def->plugin->flags & LYEXT_OPT_INHERIT)) {
            v = malloc(sizeof *v);
            LY_CHECK_ERR_RETURN(!v, LOGMEM(augment->module->ctx), -1);
            *v = u;
            if (unres_schema_add_node(lys_main_module(augment->module), unres, &augment->target->ext,
                    UNRES_EXT_FINALIZE, (struct lys_node *)v) == -1) {
                /* something really bad happend since the extension finalization is not actually
                 * being resolved while adding into unres, so something more serious with the unres
                 * list itself must happened */
                return -1;
            }
        }
    }

    /* reconnect augmenting data into the target - add them to the target child list */
    if (augment->target->child) {
        child = augment->target->child->prev;
        child->next = augment->child;
        augment->target->child->prev = augment->child->prev;
        augment->child->prev = child;
    } else {
        augment->target->child = augment->child;
    }

success:
    /* remove the flag about not applicability */
    augment->flags &= ~LYS_NOTAPPLIED;
    return EXIT_SUCCESS;
}